

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O0

void __thiscall
btConeTwistConstraint::calcAngleInfo2
          (btConeTwistConstraint *this,btTransform *transA,btTransform *transB,
          btMatrix3x3 *invInertiaWorldA,btMatrix3x3 *invInertiaWorldB)

{
  bool bVar1;
  btScalar *pbVar2;
  btScalar *_y;
  btScalar *_z;
  btTransform *in_RDX;
  btTransform *in_RSI;
  long in_RDI;
  btTransform *this_00;
  btScalar bVar3;
  btScalar bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btVector3 bVar8;
  btVector3 twistAxis;
  btScalar span1;
  btScalar span2;
  btScalar z;
  btScalar y;
  btScalar x;
  btVector3 target;
  btVector3 ivB;
  btVector3 kvA;
  btVector3 jvA;
  btVector3 ivA;
  btVector3 swingAxis_1;
  btScalar swingLimit;
  btScalar swingAngle;
  btQuaternion qABTwist;
  btQuaternion qABCone;
  btVector3 vConeNoTwist;
  btQuaternion qAB;
  btQuaternion qB;
  btQuaternion qA;
  float swingAxisLen2;
  btVector3 swingAxis;
  btQuaternion qDeltaAB;
  btTransform trDeltaAB;
  btTransform trB;
  btTransform trA;
  btTransform trPose;
  undefined4 in_stack_fffffffffffffab0;
  btScalar in_stack_fffffffffffffab4;
  btScalar in_stack_fffffffffffffab8;
  btScalar in_stack_fffffffffffffabc;
  btScalar in_stack_fffffffffffffac0;
  btScalar in_stack_fffffffffffffac4;
  btScalar in_stack_fffffffffffffad8;
  btScalar in_stack_fffffffffffffadc;
  float in_stack_fffffffffffffae0;
  float in_stack_fffffffffffffae4;
  btVector3 *in_stack_fffffffffffffae8;
  btVector3 *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  btScalar in_stack_fffffffffffffafc;
  btScalar in_stack_fffffffffffffb00;
  btScalar in_stack_fffffffffffffb04;
  btTransform *in_stack_fffffffffffffb08;
  btVector3 *this_01;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  btQuaternion *in_stack_fffffffffffffb28;
  btQuaternion *in_stack_fffffffffffffb30;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_3f0;
  undefined8 local_3e8;
  btVector3 local_3e0;
  btScalar local_3d0 [4];
  undefined1 local_3c0 [16];
  btScalar local_3b0;
  btScalar local_3ac;
  btScalar local_3a8 [4];
  undefined1 local_398 [16];
  btScalar local_388;
  btScalar local_384;
  btScalar local_380;
  btVector3 local_37c;
  btScalar local_36c [4];
  btVector3 local_35c;
  btScalar local_34c [4];
  btVector3 local_33c;
  btScalar local_32c [4];
  btVector3 local_31c;
  btScalar local_30c [4];
  btVector3 local_2fc;
  btScalar local_2ec;
  btScalar local_2e8;
  btScalar local_2e4;
  btScalar local_2e0 [4];
  undefined1 local_2d0 [16];
  btVector3 local_2c0;
  float local_2b0;
  float local_2ac;
  btQuadWord local_2a8;
  btQuadWord local_298;
  btQuadWord local_288;
  btScalar local_278 [4];
  btQuadWord local_268;
  btQuadWord local_258;
  btQuadWord local_248;
  btQuadWord local_238;
  btQuadWord local_228;
  btQuadWord local_218;
  btQuadWord local_208;
  btQuadWord local_1f8;
  btScalar local_1e8;
  btVector3 local_1e4;
  btQuadWord local_1d4 [21];
  btScalar local_84;
  btScalar local_80;
  btScalar local_7c;
  btVector3 local_78 [6];
  btTransform *local_18;
  btTransform *local_10;
  
  *(undefined4 *)(in_RDI + 0x210) = 0;
  *(undefined4 *)(in_RDI + 0x20c) = 0;
  *(undefined1 *)(in_RDI + 0x225) = 0;
  *(undefined1 *)(in_RDI + 0x226) = 0;
  if (((*(byte *)(in_RDI + 0x240) & 1) == 0) || ((*(byte *)(in_RDI + 0x227) & 1) != 0)) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_208.m_floats =
         (btScalar  [4])
         btTransform::getRotation
                   ((btTransform *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_218.m_floats =
         (btScalar  [4])
         btTransform::getRotation
                   ((btTransform *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_1f8.m_floats =
         (btScalar  [4])::operator*(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    local_238.m_floats =
         (btScalar  [4])
         btTransform::getRotation
                   ((btTransform *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_248.m_floats =
         (btScalar  [4])
         btTransform::getRotation
                   ((btTransform *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_228.m_floats =
         (btScalar  [4])::operator*(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    local_268.m_floats =
         (btScalar  [4])
         btQuaternion::inverse
                   ((btQuaternion *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_258.m_floats =
         (btScalar  [4])::operator*(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    local_278 = (btScalar  [4])
                quatRotate((btQuaternion *)
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    btVector3::normalize((btVector3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0))
    ;
    local_288.m_floats =
         (btScalar  [4])
         shortestArcQuat((btVector3 *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                         (btVector3 *)in_stack_fffffffffffffb08);
    btQuaternion::normalize
              ((btQuaternion *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_2a8.m_floats =
         (btScalar  [4])
         btQuaternion::inverse
                   ((btQuaternion *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    local_298.m_floats =
         (btScalar  [4])::operator*(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    btQuaternion::normalize
              ((btQuaternion *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    if ((*(float *)(in_RDI + 0x1d4) < *(float *)(in_RDI + 0x1e0)) ||
       (*(float *)(in_RDI + 0x1d8) < *(float *)(in_RDI + 0x1e0))) {
      btTransform::getBasis(local_10);
      this_00 = (btTransform *)(in_RDI + 0x144);
      btTransform::getBasis(this_00);
      local_30c = (btScalar  [4])
                  btMatrix3x3::getColumn
                            ((btMatrix3x3 *)
                             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                             (int)in_stack_fffffffffffffabc);
      local_2fc = ::operator*((btMatrix3x3 *)
                              CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      btTransform::getBasis(local_10);
      btTransform::getBasis(this_00);
      local_32c = (btScalar  [4])
                  btMatrix3x3::getColumn
                            ((btMatrix3x3 *)
                             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                             (int)in_stack_fffffffffffffabc);
      local_31c = ::operator*((btMatrix3x3 *)
                              CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      btTransform::getBasis(local_10);
      btTransform::getBasis(this_00);
      local_34c = (btScalar  [4])
                  btMatrix3x3::getColumn
                            ((btMatrix3x3 *)
                             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                             (int)in_stack_fffffffffffffabc);
      local_33c = ::operator*((btMatrix3x3 *)
                              CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      btTransform::getBasis(local_18);
      btTransform::getBasis((btTransform *)(in_RDI + 0x184));
      local_36c = (btScalar  [4])
                  btMatrix3x3::getColumn
                            ((btMatrix3x3 *)
                             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                             (int)in_stack_fffffffffffffabc);
      local_35c = ::operator*((btMatrix3x3 *)
                              CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      btVector3::btVector3(&local_37c);
      local_380 = btVector3::dot(&local_35c,&local_2fc);
      local_384 = btVector3::dot(&local_35c,&local_31c);
      local_388 = btVector3::dot(&local_35c,&local_33c);
      if ((*(float *)(in_RDI + 0x1e0) <= *(float *)(in_RDI + 0x1d4)) ||
         (*(float *)(in_RDI + 0x1e0) <= *(float *)(in_RDI + 0x1d8))) {
        if (*(float *)(in_RDI + 0x1e0) <= *(float *)(in_RDI + 0x1d4)) {
          bVar1 = btFuzzyZero(0.0);
          if (((!bVar1) || (bVar1 = btFuzzyZero(0.0), !bVar1)) &&
             (*(undefined1 *)(in_RDI + 0x226) = 1,
             *(float *)(in_RDI + 0x1e0) <= *(float *)(in_RDI + 0x1d4))) {
            local_388 = 0.0;
            local_3b0 = btAtan2(0.0,2.896058e-39);
            if (local_3b0 < *(float *)(in_RDI + 0x1d4) || local_3b0 == *(float *)(in_RDI + 0x1d4)) {
              if (local_3b0 < -*(float *)(in_RDI + 0x1d4)) {
                local_380 = btCos(0.0);
                local_384 = btSin(0.0);
                local_384 = -local_384;
              }
            }
            else {
              local_380 = btCos(0.0);
              local_384 = btSin(0.0);
            }
          }
        }
        else {
          bVar1 = btFuzzyZero(0.0);
          if (((!bVar1) || (bVar1 = btFuzzyZero(0.0), !bVar1)) &&
             (*(undefined1 *)(in_RDI + 0x226) = 1,
             *(float *)(in_RDI + 0x1e0) <= *(float *)(in_RDI + 0x1d8))) {
            local_384 = 0.0;
            local_3ac = btAtan2(0.0,2.895586e-39);
            if (local_3ac < *(float *)(in_RDI + 0x1d8) || local_3ac == *(float *)(in_RDI + 0x1d8)) {
              if (local_3ac < -*(float *)(in_RDI + 0x1d8)) {
                local_380 = btCos(0.0);
                local_388 = btSin(0.0);
                local_388 = -local_388;
              }
            }
            else {
              local_380 = btCos(0.0);
              local_388 = btSin(0.0);
            }
          }
        }
        in_stack_fffffffffffffae8 = &local_2fc;
        in_stack_fffffffffffffabc = local_380;
        pbVar2 = btVector3::operator_cast_to_float_(in_stack_fffffffffffffae8);
        in_stack_fffffffffffffac0 = *pbVar2;
        in_stack_fffffffffffffaf0 = &local_31c;
        in_stack_fffffffffffffab8 = local_384;
        pbVar2 = btVector3::operator_cast_to_float_(in_stack_fffffffffffffaf0);
        fVar7 = in_stack_fffffffffffffab8 * *pbVar2;
        fVar5 = in_stack_fffffffffffffabc * in_stack_fffffffffffffac0;
        this_01 = &local_33c;
        in_stack_fffffffffffffac4 = local_388;
        pbVar2 = btVector3::operator_cast_to_float_(this_01);
        fVar6 = in_stack_fffffffffffffac4 * *pbVar2;
        pbVar2 = btVector3::operator_cast_to_float_(&local_37c);
        bVar4 = local_380;
        *pbVar2 = fVar6 + fVar5 + fVar7;
        pbVar2 = btVector3::operator_cast_to_float_(in_stack_fffffffffffffae8);
        bVar3 = local_384;
        in_stack_fffffffffffffad8 = pbVar2[1];
        pbVar2 = btVector3::operator_cast_to_float_(in_stack_fffffffffffffaf0);
        in_stack_fffffffffffffae0 = bVar4 * in_stack_fffffffffffffad8 + bVar3 * pbVar2[1];
        in_stack_fffffffffffffadc = local_388;
        pbVar2 = btVector3::operator_cast_to_float_(this_01);
        in_stack_fffffffffffffae4 =
             in_stack_fffffffffffffadc * pbVar2[1] + in_stack_fffffffffffffae0;
        pbVar2 = btVector3::operator_cast_to_float_(&local_37c);
        pbVar2[1] = in_stack_fffffffffffffae4;
        in_stack_fffffffffffffb00 = local_380;
        pbVar2 = btVector3::operator_cast_to_float_(in_stack_fffffffffffffae8);
        in_stack_fffffffffffffb04 = pbVar2[2];
        in_stack_fffffffffffffafc = local_384;
        pbVar2 = btVector3::operator_cast_to_float_(in_stack_fffffffffffffaf0);
        fVar5 = in_stack_fffffffffffffb00 * in_stack_fffffffffffffb04 +
                in_stack_fffffffffffffafc * pbVar2[2];
        bVar3 = local_388;
        pbVar2 = btVector3::operator_cast_to_float_(this_01);
        fVar5 = bVar3 * pbVar2[2] + fVar5;
        pbVar2 = btVector3::operator_cast_to_float_(&local_37c);
        pbVar2[2] = fVar5;
        btVector3::normalize
                  ((btVector3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
        local_3d0 = (btScalar  [4])
                    btVector3::cross((btVector3 *)
                                     CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                                     (btVector3 *)
                                     CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        local_3c0 = (undefined1  [16])
                    operator-((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
        *(undefined8 *)(in_RDI + 0x1e4) = local_3c0._0_8_;
        *(undefined8 *)(in_RDI + 0x1ec) = local_3c0._8_8_;
        bVar3 = btVector3::length((btVector3 *)0x1f8c99);
        *(btScalar *)(in_RDI + 0x210) = bVar3;
        bVar1 = btFuzzyZero(0.0);
        if (!bVar1) {
          btVector3::normalize
                    ((btVector3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
        }
      }
      else {
        bVar1 = btFuzzyZero(0.0);
        if ((!bVar1) || (bVar1 = btFuzzyZero(0.0), !bVar1)) {
          *(undefined1 *)(in_RDI + 0x226) = 1;
          local_3a8 = (btScalar  [4])
                      btVector3::cross((btVector3 *)
                                       CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                                       ,(btVector3 *)
                                        CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8
                                                ));
          local_398 = (undefined1  [16])
                      operator-((btVector3 *)
                                CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
          *(undefined8 *)(in_RDI + 0x1e4) = local_398._0_8_;
          *(undefined8 *)(in_RDI + 0x1ec) = local_398._8_8_;
        }
      }
    }
    else {
      local_2b0 = 0.0;
      btVector3::btVector3(&local_2c0);
      computeConeLimitInfo
                ((btConeTwistConstraint *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (btQuaternion *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0->m_floats,in_stack_fffffffffffffae8,
                 (btScalar *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      if (local_2b0 * *(float *)(in_RDI + 0x1c4) < local_2ac) {
        *(undefined1 *)(in_RDI + 0x226) = 1;
        *(undefined4 *)(in_RDI + 0x228) = 0x3f800000;
        if ((local_2ac < local_2b0) &&
           (*(float *)(in_RDI + 0x1c4) <= 0.9999999 && *(float *)(in_RDI + 0x1c4) != 0.9999999)) {
          *(float *)(in_RDI + 0x228) =
               (-local_2b0 * *(float *)(in_RDI + 0x1c4) + local_2ac) /
               (-local_2b0 * *(float *)(in_RDI + 0x1c4) + local_2b0);
        }
        *(float *)(in_RDI + 0x210) = local_2ac - local_2b0 * *(float *)(in_RDI + 0x1c4);
        adjustSwingAxisToUseEllipseNormal
                  ((btConeTwistConstraint *)
                   CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                   (btVector3 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        local_2e0 = (btScalar  [4])
                    operator-((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
        local_2d0 = (undefined1  [16])
                    quatRotate((btQuaternion *)
                               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                               (btVector3 *)
                               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        *(undefined8 *)(in_RDI + 0x1e4) = local_2d0._0_8_;
        *(undefined8 *)(in_RDI + 0x1ec) = local_2d0._8_8_;
        local_2e4 = 0.0;
        local_2e8 = 0.0;
        local_2ec = 0.0;
        btVector3::setValue((btVector3 *)(in_RDI + 0x230),&local_2e4,&local_2e8,&local_2ec);
        bVar3 = computeAngularImpulseDenominator
                          ((btVector3 *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           (btMatrix3x3 *)
                           CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        bVar4 = computeAngularImpulseDenominator
                          ((btVector3 *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           (btMatrix3x3 *)
                           CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        *(float *)(in_RDI + 0x204) = 1.0 / (bVar3 + bVar4);
      }
    }
    if (*(float *)(in_RDI + 0x1dc) < 0.0) {
      *(undefined4 *)(in_RDI + 0x218) = 0;
    }
    else {
      btVector3::btVector3(&local_3e0);
      computeTwistLimitInfo
                ((btConeTwistConstraint *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (btQuaternion *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0->m_floats,in_stack_fffffffffffffae8);
      if (*(float *)(in_RDI + 0x1dc) * *(float *)(in_RDI + 0x1c4) < *(float *)(in_RDI + 0x218)) {
        *(undefined1 *)(in_RDI + 0x225) = 1;
        *(undefined4 *)(in_RDI + 0x22c) = 0x3f800000;
        if ((*(float *)(in_RDI + 0x218) < *(float *)(in_RDI + 0x1dc)) &&
           (*(float *)(in_RDI + 0x1c4) <= 0.9999999 && *(float *)(in_RDI + 0x1c4) != 0.9999999)) {
          *(float *)(in_RDI + 0x22c) =
               (-*(float *)(in_RDI + 0x1dc) * *(float *)(in_RDI + 0x1c4) +
               *(float *)(in_RDI + 0x218)) /
               (-*(float *)(in_RDI + 0x1dc) * *(float *)(in_RDI + 0x1c4) +
               *(float *)(in_RDI + 0x1dc));
        }
        *(float *)(in_RDI + 0x214) =
             *(float *)(in_RDI + 0x218) - *(float *)(in_RDI + 0x1dc) * *(float *)(in_RDI + 0x1c4);
        operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
        bVar8 = quatRotate((btQuaternion *)
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        local_3f0 = bVar8.m_floats._0_8_;
        *(undefined8 *)(in_RDI + 500) = local_3f0;
        local_3e8 = bVar8.m_floats._8_8_;
        *(undefined8 *)(in_RDI + 0x1fc) = local_3e8;
        in_stack_fffffffffffffab4 =
             computeAngularImpulseDenominator
                       ((btVector3 *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                        (btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8)
                       );
        bVar3 = computeAngularImpulseDenominator
                          ((btVector3 *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           (btMatrix3x3 *)
                           CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        *(float *)(in_RDI + 0x208) = 1.0 / (in_stack_fffffffffffffab4 + bVar3);
      }
      if ((*(byte *)(in_RDI + 0x226) & 1) != 0) {
        operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
        bVar8 = quatRotate((btQuaternion *)
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        local_410 = bVar8.m_floats._0_8_;
        *(undefined8 *)(in_RDI + 0x230) = local_410;
        local_408 = bVar8.m_floats._8_8_;
        *(undefined8 *)(in_RDI + 0x238) = local_408;
      }
    }
  }
  else {
    local_7c = 0.0;
    local_80 = 0.0;
    local_84 = 0.0;
    btVector3::btVector3(local_78,&local_7c,&local_80,&local_84);
    btTransform::btTransform
              ((btTransform *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               (btQuaternion *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (btVector3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    btTransform::operator*
              (in_stack_fffffffffffffb08,
               (btTransform *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    btTransform::operator*
              (in_stack_fffffffffffffb08,
               (btTransform *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    btTransform::operator*
              (in_stack_fffffffffffffb08,
               (btTransform *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    btTransform::inverse
              ((btTransform *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    btTransform::operator*
              (in_stack_fffffffffffffb08,
               (btTransform *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    local_1d4[0].m_floats =
         (btScalar  [4])
         btTransform::getRotation
                   ((btTransform *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    pbVar2 = btQuadWord::x(local_1d4);
    _y = btQuadWord::y(local_1d4);
    _z = btQuadWord::z(local_1d4);
    btVector3::btVector3(&local_1e4,pbVar2,_y,_z);
    local_1e8 = btVector3::length2((btVector3 *)0x1f7eb0);
    bVar1 = btFuzzyZero(0.0);
    if (!bVar1) {
      *(undefined8 *)(in_RDI + 0x1e4) = local_1e4.m_floats._0_8_;
      *(undefined8 *)(in_RDI + 0x1ec) = local_1e4.m_floats._8_8_;
      btVector3::normalize
                ((btVector3 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
      bVar3 = btQuaternion::getAngle
                        ((btQuaternion *)
                         CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
      *(btScalar *)(in_RDI + 0x210) = bVar3;
      bVar1 = btFuzzyZero(0.0);
      if (!bVar1) {
        *(undefined1 *)(in_RDI + 0x226) = 1;
      }
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::calcAngleInfo2(const btTransform& transA, const btTransform& transB, const btMatrix3x3& invInertiaWorldA,const btMatrix3x3& invInertiaWorldB)
{
	m_swingCorrection = btScalar(0.);
	m_twistLimitSign = btScalar(0.);
	m_solveTwistLimit = false;
	m_solveSwingLimit = false;
	// compute rotation of A wrt B (in constraint space)
	if (m_bMotorEnabled && (!m_useSolveConstraintObsolete))
	{	// it is assumed that setMotorTarget() was alredy called 
		// and motor target m_qTarget is within constraint limits
		// TODO : split rotation to pure swing and pure twist
		// compute desired transforms in world
		btTransform trPose(m_qTarget);
		btTransform trA = transA * m_rbAFrame;
		btTransform trB = transB * m_rbBFrame;
		btTransform trDeltaAB = trB * trPose * trA.inverse();
		btQuaternion qDeltaAB = trDeltaAB.getRotation();
		btVector3 swingAxis = 	btVector3(qDeltaAB.x(), qDeltaAB.y(), qDeltaAB.z());
		float swingAxisLen2 = swingAxis.length2();
		if(btFuzzyZero(swingAxisLen2))
		{
		   return;
		}
		m_swingAxis = swingAxis;
		m_swingAxis.normalize();
		m_swingCorrection = qDeltaAB.getAngle();
		if(!btFuzzyZero(m_swingCorrection))
		{
			m_solveSwingLimit = true;
		}
		return;
	}


	{
		// compute rotation of A wrt B (in constraint space)
		btQuaternion qA = transA.getRotation() * m_rbAFrame.getRotation();
		btQuaternion qB = transB.getRotation() * m_rbBFrame.getRotation();
		btQuaternion qAB = qB.inverse() * qA;
		// split rotation into cone and twist
		// (all this is done from B's perspective. Maybe I should be averaging axes...)
		btVector3 vConeNoTwist = quatRotate(qAB, vTwist); vConeNoTwist.normalize();
		btQuaternion qABCone  = shortestArcQuat(vTwist, vConeNoTwist); qABCone.normalize();
		btQuaternion qABTwist = qABCone.inverse() * qAB; qABTwist.normalize();

		if (m_swingSpan1 >= m_fixThresh && m_swingSpan2 >= m_fixThresh)
		{
			btScalar swingAngle, swingLimit = 0; btVector3 swingAxis;
			computeConeLimitInfo(qABCone, swingAngle, swingAxis, swingLimit);

			if (swingAngle > swingLimit * m_limitSoftness)
			{
				m_solveSwingLimit = true;

				// compute limit ratio: 0->1, where
				// 0 == beginning of soft limit
				// 1 == hard/real limit
				m_swingLimitRatio = 1.f;
				if (swingAngle < swingLimit && m_limitSoftness < 1.f - SIMD_EPSILON)
				{
					m_swingLimitRatio = (swingAngle - swingLimit * m_limitSoftness)/
										(swingLimit - swingLimit * m_limitSoftness);
				}				

				// swing correction tries to get back to soft limit
				m_swingCorrection = swingAngle - (swingLimit * m_limitSoftness);

				// adjustment of swing axis (based on ellipse normal)
				adjustSwingAxisToUseEllipseNormal(swingAxis);

				// Calculate necessary axis & factors		
				m_swingAxis = quatRotate(qB, -swingAxis);

				m_twistAxisA.setValue(0,0,0);

				m_kSwing =  btScalar(1.) /
					(computeAngularImpulseDenominator(m_swingAxis,invInertiaWorldA) +
					 computeAngularImpulseDenominator(m_swingAxis,invInertiaWorldB));
			}
		}
		else
		{
			// you haven't set any limits;
			// or you're trying to set at least one of the swing limits too small. (if so, do you really want a conetwist constraint?)
			// anyway, we have either hinge or fixed joint
			btVector3 ivA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(0);
			btVector3 jvA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(1);
			btVector3 kvA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(2);
			btVector3 ivB = transB.getBasis() * m_rbBFrame.getBasis().getColumn(0);
			btVector3 target;
			btScalar x = ivB.dot(ivA);
			btScalar y = ivB.dot(jvA);
			btScalar z = ivB.dot(kvA);
			if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
			{ // fixed. We'll need to add one more row to constraint
				if((!btFuzzyZero(y)) || (!(btFuzzyZero(z))))
				{
					m_solveSwingLimit = true;
					m_swingAxis = -ivB.cross(ivA);
				}
			}
			else
			{
				if(m_swingSpan1 < m_fixThresh)
				{ // hinge around Y axis
//					if(!(btFuzzyZero(y)))
					if((!(btFuzzyZero(x))) || (!(btFuzzyZero(z))))
					{
						m_solveSwingLimit = true;
						if(m_swingSpan2 >= m_fixThresh)
						{
							y = btScalar(0.f);
							btScalar span2 = btAtan2(z, x);
							if(span2 > m_swingSpan2)
							{
								x = btCos(m_swingSpan2);
								z = btSin(m_swingSpan2);
							}
							else if(span2 < -m_swingSpan2)
							{
								x =  btCos(m_swingSpan2);
								z = -btSin(m_swingSpan2);
							}
						}
					}
				}
				else
				{ // hinge around Z axis
//					if(!btFuzzyZero(z))
					if((!(btFuzzyZero(x))) || (!(btFuzzyZero(y))))
					{
						m_solveSwingLimit = true;
						if(m_swingSpan1 >= m_fixThresh)
						{
							z = btScalar(0.f);
							btScalar span1 = btAtan2(y, x);
							if(span1 > m_swingSpan1)
							{
								x = btCos(m_swingSpan1);
								y = btSin(m_swingSpan1);
							}
							else if(span1 < -m_swingSpan1)
							{
								x =  btCos(m_swingSpan1);
								y = -btSin(m_swingSpan1);
							}
						}
					}
				}
				target[0] = x * ivA[0] + y * jvA[0] + z * kvA[0];
				target[1] = x * ivA[1] + y * jvA[1] + z * kvA[1];
				target[2] = x * ivA[2] + y * jvA[2] + z * kvA[2];
				target.normalize();
				m_swingAxis = -ivB.cross(target);
                                m_swingCorrection = m_swingAxis.length();

                                if (!btFuzzyZero(m_swingCorrection))
                                    m_swingAxis.normalize();
			}
		}

		if (m_twistSpan >= btScalar(0.f))
		{
			btVector3 twistAxis;
			computeTwistLimitInfo(qABTwist, m_twistAngle, twistAxis);

			if (m_twistAngle > m_twistSpan*m_limitSoftness)
			{
				m_solveTwistLimit = true;

				m_twistLimitRatio = 1.f;
				if (m_twistAngle < m_twistSpan && m_limitSoftness < 1.f - SIMD_EPSILON)
				{
					m_twistLimitRatio = (m_twistAngle - m_twistSpan * m_limitSoftness)/
										(m_twistSpan  - m_twistSpan * m_limitSoftness);
				}

				// twist correction tries to get back to soft limit
				m_twistCorrection = m_twistAngle - (m_twistSpan * m_limitSoftness);

				m_twistAxis = quatRotate(qB, -twistAxis);

				m_kTwist = btScalar(1.) /
					(computeAngularImpulseDenominator(m_twistAxis,invInertiaWorldA) +
					 computeAngularImpulseDenominator(m_twistAxis,invInertiaWorldB));
			}

			if (m_solveSwingLimit)
				m_twistAxisA = quatRotate(qA, -twistAxis);
		}
		else
		{
			m_twistAngle = btScalar(0.f);
		}
	}
}